

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_nor_vec_mips64
               (TCGContext_conflict5 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  ushort uVar1;
  TCGOp *pTVar2;
  uintptr_t o_2;
  uint vece_00;
  uintptr_t o_1;
  uintptr_t o;
  
  uVar1 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)r);
  vece_00 = 0x9e;
  pTVar2 = tcg_emit_op_mips64(tcg_ctx,INDEX_op_or_vec);
  pTVar2->field_0x1 = (byte)((uint)uVar1 * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar2->args[2] = (TCGArg)(b + (long)tcg_ctx);
  tcg_gen_not_vec_mips64(tcg_ctx,vece_00,r,r);
  return;
}

Assistant:

void tcg_gen_nor_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    /* TODO: Add TCG_TARGET_HAS_nor_vec when adding a backend supports it. */
    tcg_gen_or_vec(tcg_ctx, 0, r, a, b);
    tcg_gen_not_vec(tcg_ctx, 0, r, r);
}